

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QSettingsIniSection * __thiscall
QMap<QString,_QSettingsIniSection>::operator[]
          (QMap<QString,_QSettingsIniSection> *this,QString *key)

{
  bool bVar1;
  pointer ppVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QSettingsIniSection>_>,_bool> pVar3;
  iterator i;
  QMap<QString,_QSettingsIniSection> copy;
  map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
  *in_stack_ffffffffffffff08;
  pair<const_QString,_QSettingsIniSection> *in_stack_ffffffffffffff10;
  map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
  *in_stack_ffffffffffffff18;
  QSettingsIniSection *pQVar4;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
                      *)in_stack_ffffffffffffff10);
  if (bVar1) {
    QMap((QMap<QString,_QSettingsIniSection> *)in_stack_ffffffffffffff10,
         (QMap<QString,_QSettingsIniSection> *)in_stack_ffffffffffffff08);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<QString,_QSettingsIniSection> *)0x7b9ddf);
  }
  detach((QMap<QString,_QSettingsIniSection> *)in_stack_ffffffffffffff10);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
                *)0x7b9e07);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
       ::find(in_stack_ffffffffffffff08,(key_type *)0x7b9e21);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
                *)0x7b9e3f);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
                  *)0x7b9e84);
    QSettingsIniSection::QSettingsIniSection((QSettingsIniSection *)0x7b9eb0);
    std::pair<const_QString,_QSettingsIniSection>::pair<QSettingsIniSection,_true>
              ((pair<const_QString,_QSettingsIniSection> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (QString *)in_stack_ffffffffffffff18,(QSettingsIniSection *)in_stack_ffffffffffffff10
              );
    pVar3 = std::
            map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
            ::insert(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_QString,_QSettingsIniSection>::~pair(in_stack_ffffffffffffff10);
    QSettingsIniSection::~QSettingsIniSection((QSettingsIniSection *)0x7b9f4b);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_QString,_QSettingsIniSection>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QString,_QSettingsIniSection>_> *)0x7b9fb3)
  ;
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<QString,_QSettingsIniSection> *)0x7b9fc9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }